

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easygetopt.c
# Opt level: O2

curl_easyoption * curl_easy_option_next(curl_easyoption *prev)

{
  if (prev == (curl_easyoption *)0x0) {
    return Curl_easyopts;
  }
  if ((prev->name != (char *)0x0) && (prev[1].name != (char *)0x0)) {
    return prev + 1;
  }
  return (curl_easyoption *)0x0;
}

Assistant:

const struct curl_easyoption *
curl_easy_option_next(const struct curl_easyoption *prev)
{
  if(prev && prev->name) {
    prev++;
    if(prev->name)
      return prev;
  }
  else if(!prev)
    return &Curl_easyopts[0];
  return NULL;
}